

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_im2col(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int s1,int p0,int p1,int d0,
           int d1,_Bool is_2D,ggml_type dst_type)

{
  ggml_tensor *pgVar1;
  int in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  byte in_stack_00000020;
  int32_t params [7];
  ggml_tensor *result;
  int64_t ne [4];
  int64_t OW;
  int64_t OH;
  void *params_00;
  ggml_tensor *tensor;
  int64_t local_90;
  void *local_40;
  ggml_backend_buffer *local_38;
  int64_t local_30;
  byte local_25;
  int local_24;
  int local_1c;
  ggml_tensor *local_18;
  ggml_tensor *local_10;
  
  local_25 = in_stack_00000020 & 1;
  if (local_25 == 0) {
    if (in_RDX->ne[1] != in_RSI->ne[1]) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xeff,"GGML_ASSERT(%s) failed","b->ne[1] == a->ne[1]");
    }
    if (in_RDX->ne[3] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xf00,"GGML_ASSERT(%s) failed","b->ne[3] == 1");
    }
  }
  else if (in_RSI->ne[2] != in_RDX->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xefc
               ,"GGML_ASSERT(%s) failed","a->ne[2] == b->ne[2]");
  }
  local_24 = in_R9D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_25 == 0) {
    local_90 = 0;
  }
  else {
    local_90 = ggml_calc_conv_output_size
                         (in_RDX->ne[1],in_RSI->ne[1],in_R8D,in_stack_00000008,in_stack_00000018);
  }
  local_30 = local_90;
  local_38 = (ggml_backend_buffer *)
             ggml_calc_conv_output_size
                       (local_18->ne[0],local_10->ne[0],local_1c,local_24,in_stack_00000010);
  if (((local_25 & 1) != 0) && (local_30 < 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf06
               ,"GGML_ASSERT(%s) failed","(!is_2D || OH > 0) && \"b too small compared to a\"");
  }
  if ((long)local_38 < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf07
               ,"GGML_ASSERT(%s) failed","(OW > 0) && \"b too small compared to a\"");
  }
  tensor = (ggml_tensor *)&local_40;
  if ((local_25 & 1) == 0) {
    params_00 = (void *)0x1;
  }
  else {
    params_00 = (void *)local_18->ne[3];
  }
  local_40 = params_00;
  pgVar1 = ggml_new_tensor((ggml_context *)tensor,(ggml_type)((ulong)params_00 >> 0x20),
                           (int)params_00,(int64_t *)0x150160);
  ggml_set_op_params(tensor,params_00,0x1501d3);
  pgVar1->op = GGML_OP_IM2COL;
  pgVar1->src[0] = local_10;
  pgVar1->src[1] = local_18;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_im2col(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1,
        bool                  is_2D,
        enum ggml_type        dst_type) {
    if (is_2D) {
        GGML_ASSERT(a->ne[2] == b->ne[2]);
    } else {
        //GGML_ASSERT(b->ne[1] % a->ne[1] == 0);
        GGML_ASSERT(b->ne[1] == a->ne[1]);
        GGML_ASSERT(b->ne[3] == 1);
    }

    const int64_t OH = is_2D ? ggml_calc_conv_output_size(b->ne[1], a->ne[1], s1, p1, d1) : 0;
    const int64_t OW =         ggml_calc_conv_output_size(b->ne[0], a->ne[0], s0, p0, d0);

    GGML_ASSERT((!is_2D || OH > 0) && "b too small compared to a");
    GGML_ASSERT((OW > 0)           && "b too small compared to a");

    const int64_t ne[4] = {
        is_2D ? (a->ne[2] * a->ne[1] * a->ne[0]) : a->ne[1] * a->ne[0],
        OW,
        is_2D ? OH : b->ne[2],
        is_2D ?      b->ne[3] : 1,
    };

    struct ggml_tensor * result = ggml_new_tensor(ctx, dst_type, 4, ne);
    int32_t params[] = { s0, s1, p0, p1, d0, d1, (is_2D ? 1 : 0) };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_IM2COL;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}